

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O3

void hrgls::datablob::DataBlobSourceThread(DataBlobSource_private *info)

{
  size_t *psVar1;
  StreamCallback p_Var2;
  void *pvVar3;
  pointer __src;
  pthread_mutex_t *__mutex;
  int iVar4;
  uint8_t *data;
  _Node *p_Var5;
  int *piVar6;
  undefined8 uVar7;
  ulong __n;
  size_t i;
  long lVar8;
  timeval val;
  DataBlob blobpp;
  hrgls_DataBlob blob;
  vector<char,_std::allocator<char>_> blobToSend;
  DataBlob local_90;
  timespec local_88;
  pthread_mutex_t *local_78;
  float local_6c;
  vector<char,_std::allocator<char>_> local_68;
  list<hrgls::datablob::DataBlob,std::allocator<hrgls::datablob::DataBlob>> *local_50;
  pthread_mutex_t *local_48;
  long local_40;
  double local_38;
  
  if (info != (DataBlobSource_private *)0x0) {
    local_40 = std::chrono::_V2::system_clock::now();
    local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (char *)0x0;
    local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (char *)0x0;
    lVar8 = 0;
    do {
      local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,(char)lVar8);
      if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,(char *)&local_88);
      }
      else {
        *local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish = (char)lVar8;
        local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
    local_48 = (pthread_mutex_t *)&info->callbackMutex;
    local_78 = (pthread_mutex_t *)&info->storedBlobsMutex;
    local_50 = (list<hrgls::datablob::DataBlob,std::allocator<hrgls::datablob::DataBlob>> *)
               &info->storedBlobs;
    do {
      if (info->running == true) {
        lVar8 = std::chrono::_V2::system_clock::now();
        local_38 = StreamProperties::Rate(&info->properties);
        local_6c = (float)(lVar8 - local_40) / 1e+09;
        val = API::GetCurrentSystemTime(info->api);
        if (1.0 / local_38 < (double)local_6c) {
          hrgls_DataBlobCreate((hrgls_DataBlob *)&local_88);
          hrgls_DataBlobSetTime((hrgls_DataBlob)local_88.tv_sec,val);
          __src = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
          __n = (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          data = (uint8_t *)operator_new__(__n);
          memcpy(data,__src,__n);
          hrgls_DataBlobSetData
                    ((hrgls_DataBlob)local_88.tv_sec,data,(uint32_t)__n,myDelete,(void *)0x0);
          __mutex = local_48;
          iVar4 = pthread_mutex_lock(local_48);
          if (iVar4 != 0) {
            iVar4 = std::__throw_system_error(iVar4);
LAB_00106ab6:
            uVar7 = std::__throw_system_error(iVar4);
            pthread_mutex_unlock(local_78);
            DataBlob::~DataBlob(&local_90);
            if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            _Unwind_Resume(uVar7);
          }
          p_Var2 = info->callbackHandler;
          pvVar3 = info->callbackUserData;
          pthread_mutex_unlock(__mutex);
          DataBlob::DataBlob(&local_90,(hrgls_DataBlob)local_88.tv_sec);
          hrgls_DataBlobDestroy((hrgls_DataBlob)local_88.tv_sec);
          if (p_Var2 == (StreamCallback)0x0) {
            iVar4 = pthread_mutex_lock(local_78);
            if (iVar4 != 0) goto LAB_00106ab6;
            p_Var5 = std::__cxx11::
                     list<hrgls::datablob::DataBlob,std::allocator<hrgls::datablob::DataBlob>>::
                     _M_create_node<hrgls::datablob::DataBlob_const&>(local_50,&local_90);
            std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
            psVar1 = &(info->storedBlobs).
                      super__List_base<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            pthread_mutex_unlock(local_78);
          }
          else {
            (*p_Var2)(&local_90,pvVar3);
          }
          DataBlob::~DataBlob(&local_90);
        }
      }
      local_88.tv_sec = 0;
      local_88.tv_nsec = 1000000;
      do {
        iVar4 = nanosleep(&local_88,&local_88);
        if (iVar4 != -1) break;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
    } while (info->quitThread != true);
    if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

static void DataBlobSourceThread(DataBlobSource::DataBlobSource_private *info)
    {
      if (!info) { return; }

      // Keeps track of how long since we sent a blob
      auto lastBlob = std::chrono::system_clock::now();

      // Make the data we're going to send.
      std::vector<char> blobToSend;
      for (size_t i = 0; i < 256; i++) {
        blobToSend.push_back(i % 256);
      }

      do {
        // See if we are streaming.
        if (info->running) {
          // See if it is time to create a new blob.
          auto now = std::chrono::system_clock::now();
          std::chrono::duration<float> dt = now - lastBlob;
          double interval = 1.0 / info->properties.Rate();
          timeval myTime = info->api->GetCurrentSystemTime();
          if (dt.count() > interval) {

            // Create a blob
            hrgls_DataBlob blob;
            hrgls_DataBlobCreate(&blob);
            hrgls_DataBlobSetTime(blob, myTime);

            // Copy the DataBlob data, make a copy, and set the deleter function for it.
            uint8_t *data = new uint8_t[blobToSend.size()];
            memcpy(data, blobToSend.data(), blobToSend.size());
            hrgls_DataBlobSetData(blob, data, static_cast<uint32_t>(blobToSend.size()),
              myDelete, nullptr);

            // Need to guard the access to the callback handler and userdata with a
            // mutex so that we don't get half of the information due to a race with the
            // main thread.
            StreamCallback callbackHandler;
            void *callbackUserData;
            {
              std::lock_guard<std::mutex> lock(info->callbackMutex);
              callbackHandler = info->callbackHandler;
              callbackUserData = info->callbackUserData;
            }

            // If we have a callback handler, call it.  If not, queue the DataBlob
            // for later delivery.
            DataBlob blobpp(blob);
            hrgls_DataBlobDestroy(blob);
            if (callbackHandler) {
              callbackHandler(blobpp, callbackUserData);
            } else {
              // Store a blob with a copy of the data onto the front of the queue for
              // GetNextBlob.
              std::lock_guard<std::mutex> lock(info->storedBlobsMutex);
              info->storedBlobs.push_back(blobpp);
            }
          } // if time for a new blob

        } // if running

        std::this_thread::sleep_for(std::chrono::milliseconds(1));
      } while (!info->quitThread);
    }